

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

void Abc_NtkSynthesize(Abc_Ntk_t **ppNtk,int fMoreEffort)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar1;
  
  pAVar1 = *ppNtk;
  Abc_NtkRewrite(pAVar1,0,0,0,0,0);
  Abc_NtkRefactor(pAVar1,10,0x10,0,0,0,0);
  pNtk = Abc_NtkBalance(pAVar1,0,0,0);
  Abc_NtkDelete(pAVar1);
  if (fMoreEffort != 0) {
    Abc_NtkRewrite(pNtk,0,0,0,0,0);
    Abc_NtkRefactor(pNtk,10,0x10,0,0,0,0);
    pAVar1 = Abc_NtkBalance(pNtk,0,0,0);
    Abc_NtkDelete(pNtk);
    pNtk = Abc_NtkIvyFraig(pAVar1,100,1,0,0,0);
    Abc_NtkDelete(pAVar1);
  }
  *ppNtk = pNtk;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs fast synthesis.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkSynthesize( Abc_Ntk_t ** ppNtk, int fMoreEffort )
{
    extern Abc_Ntk_t * Abc_NtkIvyFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fVerbose );

    Abc_Ntk_t * pNtk, * pNtkTemp;

    pNtk = *ppNtk;

    Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
    Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
    pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
    Abc_NtkDelete( pNtkTemp );

    if ( fMoreEffort )
    {
        Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
        Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
        pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
        Abc_NtkDelete( pNtkTemp );

        pNtk = Abc_NtkIvyFraig( pNtkTemp = pNtk, 100, 1, 0, 0, 0 );
        Abc_NtkDelete( pNtkTemp );
    }

    *ppNtk = pNtk;
}